

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

qsizetype __thiscall QRegularExpressionMatch::capturedLength(QRegularExpressionMatch *this,int nth)

{
  QRegularExpressionMatch *this_00;
  qsizetype qVar1;
  undefined8 in_RDI;
  int nth_00;
  QRegularExpressionMatch *in_stack_ffffffffffffffe8;
  
  nth_00 = (int)((ulong)in_RDI >> 0x20);
  this_00 = (QRegularExpressionMatch *)capturedEnd(in_stack_ffffffffffffffe8,nth_00);
  qVar1 = capturedStart(this_00,nth_00);
  return (long)this_00 - qVar1;
}

Assistant:

qsizetype QRegularExpressionMatch::capturedLength(int nth) const
{
    // bound checking performed by these two functions
    return capturedEnd(nth) - capturedStart(nth);
}